

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O1

string * __thiscall
tinyformat::
format<std::__cxx11::string,long,int,int,int,std::__cxx11::string,double,double,double,double,double,double,double,double,double,double,double,double,double,double,double>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,long *args_1,
          int *args_2,int *args_3,int *args_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5,double *args_6,
          double *args_7,double *args_8,double *args_9,double *args_10,double *args_11,
          double *args_12,double *args_13,double *args_14,double *args_15,double *args_16,
          double *args_17,double *args_18,double *args_19,double *args_20)

{
  long in_FS_OFFSET;
  ostringstream oss;
  ostringstream local_1b0 [112];
  ios_base local_140 [264];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  format<std::__cxx11::string,long,int,int,int,std::__cxx11::string,double,double,double,double,double,double,double,double,double,double,double,double,double,double,double>
            ((ostream *)local_1b0,(char *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fmt,(long *)args,
             (int *)args_1,args_2,args_3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_4,
             (double *)args_5,args_6,args_7,args_8,args_9,args_10,args_11,args_12,args_13,args_14,
             args_15,args_16,args_17,args_18,args_19);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  std::ios_base::~ios_base(local_140);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}